

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_optimizer.cpp
# Opt level: O0

tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> __thiscall
pfederc::optimizeUnOpExpr(pfederc *this,UnOpExpr *expr,size_t *reducedexpressions)

{
  Lexer *__args_1;
  Position *__args_2;
  _Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>
  extraout_RDX;
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> tVar1;
  bool local_49;
  __uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_48;
  undefined1 local_40 [16];
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> newexpr;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> local_28;
  unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> newincludedexpr;
  size_t *reducedexpressions_local;
  UnOpExpr *expr_local;
  
  newincludedexpr._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>.
  _M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
       reducedexpressions;
  UnOpExpr::getExpressionPtr((UnOpExpr *)&newexpr);
  optimizeAll((pfederc *)&local_28,&newexpr,
              (size_t *)
              newincludedexpr._M_t.
              super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
              super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
              super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&newexpr);
  __args_1 = Expr::getLexer(&expr->super_Expr);
  __args_2 = Expr::getPosition(&expr->super_Expr);
  local_48._M_t.super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       (tuple<pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>)UnOpExpr::getOperatorToken(expr)
  ;
  std::
  make_unique<pfederc::UnOpExpr,pfederc::Lexer_const&,pfederc::Position_const&,pfederc::Token_const*,std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>>
            ((Lexer *)local_40,(Position *)__args_1,(Token **)__args_2,
             (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)&local_48);
  std::unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>>::
  unique_ptr<pfederc::UnOpExpr,std::default_delete<pfederc::UnOpExpr>,void>
            ((unique_ptr<pfederc::Expr,std::default_delete<pfederc::Expr>> *)(local_40 + 8),
             (unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)local_40);
  std::unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_>::~unique_ptr
            ((unique_ptr<pfederc::UnOpExpr,_std::default_delete<pfederc::UnOpExpr>_> *)local_40);
  if (expr != (UnOpExpr *)0x0) {
    UnOpExpr::~UnOpExpr(expr);
    operator_delete(expr,0x48);
  }
  local_49 = false;
  std::tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>::
  tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool,_true>
            ((tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool> *)
             this,(unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_40 + 8),
             &local_49);
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr
            ((unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> *)(local_40 + 8));
  std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>::~unique_ptr(&local_28);
  tVar1.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  super__Head_base<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_false>.
  _M_head_impl._M_t.super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
  super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
  super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl =
       extraout_RDX._M_head_impl._M_t.
       super___uniq_ptr_impl<pfederc::Expr,_std::default_delete<pfederc::Expr>_>._M_t.
       super__Tuple_impl<0UL,_pfederc::Expr_*,_std::default_delete<pfederc::Expr>_>.
       super__Head_base<0UL,_pfederc::Expr_*,_false>._M_head_impl;
  tVar1.
  super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>.
  _0_8_ = this;
  return (tuple<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>)
         tVar1.
         super__Tuple_impl<0UL,_std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_bool>
  ;
}

Assistant:

std::tuple<std::unique_ptr<Expr>, bool /* changed */> pfederc::optimizeUnOpExpr(
    UnOpExpr *expr, size_t &reducedexpressions) noexcept {
  std::unique_ptr<Expr> newincludedexpr = optimizeAll(expr->getExpressionPtr(), reducedexpressions);
  std::unique_ptr<Expr> newexpr = std::make_unique<UnOpExpr>(expr->getLexer(),
      expr->getPosition(), &(expr->getOperatorToken()),
        std::move(newincludedexpr));
  delete expr;

  return std::tuple<std::unique_ptr<Expr>, bool>(std::move(newexpr), false);
}